

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void __thiscall
wasm::TypeUpdater::noteAddition
          (TypeUpdater *this,Expression *curr,Expression *parent,Expression *previous)

{
  bool bVar1;
  _Self local_38;
  _Self local_30;
  Expression *local_28;
  Expression *previous_local;
  Expression *parent_local;
  Expression *curr_local;
  TypeUpdater *this_local;
  
  local_28 = previous;
  previous_local = parent;
  parent_local = curr;
  curr_local = (Expression *)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<wasm::Expression_*,_wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
       ::find(&this->parents,&parent_local);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<wasm::Expression_*,_wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
       ::end(&this->parents);
  bVar1 = std::operator==(&local_30,&local_38);
  if (!bVar1) {
    __assert_fail("parents.find(curr) == parents.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.h"
                  ,0x96,
                  "void wasm::TypeUpdater::noteAddition(Expression *, Expression *, Expression *)");
  }
  noteRemovalOrAddition(this,parent_local,previous_local);
  if ((local_28 != (Expression *)0x0) &&
     (bVar1 = wasm::Type::operator==(&local_28->type,&parent_local->type), bVar1)) {
    return;
  }
  propagateTypesUp(this,parent_local);
  return;
}

Assistant:

void noteAddition(Expression* curr,
                    Expression* parent,
                    Expression* previous = nullptr) {
    assert(parents.find(curr) == parents.end()); // must not already exist
    noteRemovalOrAddition(curr, parent);
    // if we didn't replace with the exact same type, propagate types up
    if (!(previous && previous->type == curr->type)) {
      propagateTypesUp(curr);
    }
  }